

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O1

void __thiscall CVmFmtTabStop::~CVmFmtTabStop(CVmFmtTabStop *this)

{
  CVmHashEntry::~CVmHashEntry((CVmHashEntry *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

class CVmFmtTabStop: public CVmHashEntryCS
{
public:
    CVmFmtTabStop(const char *id, size_t idlen)
        : CVmHashEntryCS(id, idlen, TRUE)
    {
        /* we don't know our column yet */
        column_ = 0;
    }

    /* the column where the tab is defined */
    int column_;

    /*
     *   Find a tabstop object with a given ID, optionally creating a new
     *   object if an existing one isn't found.  
     */
    static CVmFmtTabStop *find(CVmHashTable *hashtab, wchar_t *id, int create)
    {
        /* 
         *   Get the length - in characters AND in bytes - of the new ID.
         *   We mostly work with the new ID in bytes rather than wchar_t's,
         *   because the underlying hash table does everything in bytes.  
         */
        
        /* 
         *   Convert the new ID to folded case.  The hash table doesn't deal
         *   with unicode case conversions, so we use a case-sensitive hash
         *   table and simply make sure we only give it lower-case
         *   characters.  
         */
        size_t flen = fold_case(0, id);
        wchar_t *fid = 0;
        if (flen != 0)
            fid = new wchar_t[flen+1];

        CVmFmtTabStop *entry = 0;
        err_try
        {
            /* do the folding if applicable */
            if (fid != 0)
            {
                fold_case(fid, id);
                id = fid;
            }

            /* get the folded ID length in characters and bytes */
            size_t id_chars = wcslen(id);
            size_t id_bytes = id_chars * sizeof(wchar_t);
            
            /* look for an existing tab-stop entry with the same ID */
            entry = (CVmFmtTabStop *)hashtab->find((char *)id, id_bytes);
            
            /* if we didn't find it, and they want to create it, do so */
            if (entry == 0 && create)
                hashtab->add(entry = new CVmFmtTabStop((char *)id, id_bytes));
        }
        err_finally
        {
            /* if we allocated the ID string, release it */
            if (fid != 0)
                delete [] fid;
        }
        err_end;

        /* return what we found */
        return entry;
    }

    /* get the case folding of a string */
    static size_t fold_case(wchar_t *dst, const wchar_t *str)
    {
        size_t dstlen = 0;
        for ( ; *str != 0 ; ++str)
        {
            /* 
             *   get the case folding of the current character, defaulting to
             *   an identity mapping if there's no folding defined 
             */
            const wchar_t *f = t3_to_fold(*str);
            wchar_t fi[2] = { *str, 0 };
            if (f == 0)
                f = fi;

            /* copy it to the output if there's an output buffer */
            for ( ; *f != 0 ; ++f, ++dstlen)
            {
                if (dst != 0)
                    *dst++ = *f;
            }
        }

        /* add the null */
        if (dst != 0)
            *dst = 0;
        
        /* return the length (excluding the null) */
        return dstlen;
    }